

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

ProStringList * __thiscall QMakeEvaluator::valuesRef(QMakeEvaluator *this,ProKey *variableName)

{
  ulong uVar1;
  iterator this_00;
  ulong uVar2;
  const_iterator cVar3;
  ProStringList *pPVar4;
  char16_t *pcVar5;
  ulong uVar6;
  _List_node_base *p_Var7;
  _Base_ptr p_Var8;
  bool bVar9;
  
  this_00._M_node =
       (_Base_ptr)
       QMap<ProKey,_ProStringList>::find
                 ((QMap<ProKey,_ProStringList> *)
                  ((this->m_valuemapStack).
                   super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   .
                   super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev + 1),variableName);
  p_Var7 = (this->m_valuemapStack).
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  QMap<ProKey,_ProStringList>::detach((QMap<ProKey,_ProStringList> *)(p_Var7 + 1));
  if (this_00._M_node != (_Base_ptr)(p_Var7[1]._M_next + 1)) {
    p_Var8 = (_Base_ptr)((long)this_00._M_node + 0x50);
    if (*(long *)((long)this_00._M_node + 0x58) != QMakeInternal::statics._608_8_) {
      return (ProStringList *)p_Var8;
    }
    QList<ProString>::clear((QList<ProString> *)p_Var8);
    return (ProStringList *)p_Var8;
  }
  uVar2 = (ulong)(variableName->super_ProString).m_length;
  pcVar5 = (variableName->super_ProString).m_string.d.ptr;
  if (pcVar5 == (char16_t *)0x0) {
    pcVar5 = (char16_t *)&QString::_empty;
  }
  bVar9 = (long)uVar2 < 1;
  if ((long)uVar2 < 1) {
LAB_0027ccef:
    if (bVar9) goto LAB_0027cd93;
  }
  else if ((ushort)(pcVar5[(variableName->super_ProString).m_offset] + L'￐') < 10) {
    uVar1 = 1;
    do {
      uVar6 = uVar1;
      if (uVar2 == uVar6) break;
      uVar1 = uVar6 + 1;
    } while ((ushort)((pcVar5 + (variableName->super_ProString).m_offset)[uVar6] + L'￐') < 10);
    bVar9 = uVar2 <= uVar6;
    goto LAB_0027ccef;
  }
  p_Var7 = (this->m_valuemapStack).
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  if (p_Var7 == (this->m_valuemapStack).
                super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                .
                super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
    bVar9 = true;
  }
  else {
    do {
      p_Var7 = p_Var7->_M_prev;
      if (p_Var7[1]._M_next == (_List_node_base *)0x0) {
        cVar3._M_node = (_Base_ptr)0x0;
      }
      else {
        cVar3 = std::
                _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                        *)&(p_Var7[1]._M_next)->_M_prev,variableName);
      }
      p_Var8 = (_Base_ptr)(p_Var7[1]._M_next + 1);
      if (p_Var7[1]._M_next == (_List_node_base *)0x0) {
        p_Var8 = (_Base_ptr)0x0;
      }
      bVar9 = cVar3._M_node == p_Var8;
      if ((!bVar9) &&
         (this_00._M_node =
               (_Base_ptr)
               QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)
                          ((this->m_valuemapStack).
                           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           .
                           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           ._M_impl._M_node.super__List_node_base._M_prev + 1),variableName),
         cVar3._M_node[2]._M_right != (_Base_ptr)QMakeInternal::statics._608_8_)) {
        QArrayDataPointer<ProString>::operator=
                  ((QArrayDataPointer<ProString> *)this_00._M_node,
                   (QArrayDataPointer<ProString> *)&cVar3._M_node[2]._M_left);
      }
    } while ((cVar3._M_node == p_Var8) &&
            (p_Var7 != (this->m_valuemapStack).
                       super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       .
                       super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next));
  }
  if (!bVar9) {
    return (ProStringList *)this_00._M_node;
  }
LAB_0027cd93:
  pPVar4 = QMap<ProKey,_ProStringList>::operator[]
                     ((QMap<ProKey,_ProStringList> *)
                      ((this->m_valuemapStack).
                       super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       .
                       super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       ._M_impl._M_node.super__List_node_base._M_prev + 1),variableName);
  return pPVar4;
}

Assistant:

ProStringList &QMakeEvaluator::valuesRef(const ProKey &variableName)
{
    ProValueMap::Iterator it = m_valuemapStack.top().find(variableName);
    if (it != m_valuemapStack.top().end()) {
        if (it->constBegin() == statics.fakeValue.constBegin())
            it->clear();
        return *it;
    }
    if (!isFunctParam(variableName)) {
        ProValueMapStack::iterator vmi = m_valuemapStack.end();
        if (--vmi != m_valuemapStack.begin()) {
            do {
                --vmi;
                ProValueMap::ConstIterator it = (*vmi).constFind(variableName);
                if (it != (*vmi).constEnd()) {
                    ProStringList &ret = m_valuemapStack.top()[variableName];
                    if (it->constBegin() != statics.fakeValue.constBegin())
                        ret = *it;
                    return ret;
                }
            } while (vmi != m_valuemapStack.begin());
        }
    }
    return m_valuemapStack.top()[variableName];
}